

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O1

bool __thiscall ON_RevSurface::IsSpherical(ON_RevSurface *this,ON_Sphere *sphere,double tolerance)

{
  ON_Line *this_00;
  ON_Curve *this_01;
  double dVar1;
  bool bVar2;
  int iVar3;
  ON_3dPoint *pOVar4;
  long lVar5;
  ON_Plane *pOVar6;
  ON_Circle *pOVar7;
  byte bVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  ON_3dPoint P;
  ON_Plane plane;
  ON_Arc arc;
  ON_3dVector local_1a8;
  double local_190;
  ON_3dPoint local_188;
  ON_Plane local_168;
  ON_3dVector local_e0;
  ON_Circle local_c8;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  bVar8 = 0;
  if (this->m_curve == (ON_Curve *)0x0) {
    return false;
  }
  local_190 = tolerance;
  ON_Plane::ON_Plane(&local_168);
  pOVar6 = &ON_Plane::World_xy;
  pOVar7 = &local_c8;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pOVar7->plane).origin.x = (pOVar6->origin).x;
    pOVar6 = (ON_Plane *)((long)pOVar6 + ((ulong)bVar8 * -2 + 1) * 8);
    pOVar7 = (ON_Circle *)((long)pOVar7 + ((ulong)bVar8 * -2 + 1) * 8);
  }
  local_c8.radius = 1.0;
  local_40 = ON_Interval::ZeroToTwoPi.m_t[0]._0_4_;
  uStack_3c = ON_Interval::ZeroToTwoPi.m_t[0]._4_4_;
  uStack_38 = ON_Interval::ZeroToTwoPi.m_t[1]._0_4_;
  uStack_34 = ON_Interval::ZeroToTwoPi.m_t[1]._4_4_;
  this_01 = this->m_curve;
  (*(this_01->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(this_01);
  local_1a8.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  local_1a8.y = in_XMM1_Qa;
  dVar1 = ON_Interval::Mid((ON_Interval *)&local_1a8);
  ON_Curve::PointAt(&local_188,this_01,dVar1);
  this_00 = &this->m_axis;
  local_168.origin.x = (this->m_axis).from.x;
  local_168.origin.y = (this->m_axis).from.y;
  local_168.origin.z = (this->m_axis).from.z;
  ON_Line::Tangent(&local_1a8,this_00);
  local_168.yaxis.z = local_1a8.z;
  local_168.yaxis.x = local_1a8.x;
  local_168.yaxis.y = local_1a8.y;
  ON_3dPoint::operator-(&local_e0,&local_188,&local_168.origin);
  ON_CrossProduct(&local_1a8,&local_e0,&local_168.yaxis);
  local_168.zaxis.z = local_1a8.z;
  local_168.zaxis.x = local_1a8.x;
  local_168.zaxis.y = local_1a8.y;
  ON_3dVector::Unitize(&local_168.zaxis);
  ON_CrossProduct(&local_1a8,&local_168.yaxis,&local_168.zaxis);
  local_168.xaxis.z = local_1a8.z;
  local_168.xaxis.x = local_1a8.x;
  local_168.xaxis.y = local_1a8.y;
  ON_Plane::UpdateEquation(&local_168);
  bVar2 = ON_Plane::IsValid(&local_168);
  if ((bVar2) &&
     (iVar3 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])
                        (SUB84(local_190,0),this->m_curve,&local_168,&local_c8), (char)iVar3 != '\0'
     )) {
    pOVar4 = ON_Circle::Center(&local_c8);
    ON_Line::ClosestPointTo((ON_3dPoint *)&local_1a8,this_00,pOVar4);
    local_188.z = local_1a8.z;
    local_188.x = local_1a8.x;
    local_188.y = local_1a8.y;
    pOVar4 = ON_Circle::Center(&local_c8);
    dVar1 = ON_3dPoint::DistanceTo(&local_188,pOVar4);
    if (dVar1 <= local_190) {
      bVar2 = true;
      if (sphere != (ON_Sphere *)0x0) {
        pOVar4 = ON_Circle::Center(&local_c8);
        (sphere->plane).origin.z = pOVar4->z;
        dVar1 = pOVar4->y;
        (sphere->plane).origin.x = pOVar4->x;
        (sphere->plane).origin.y = dVar1;
        ON_Line::Tangent(&local_1a8,this_00);
        (sphere->plane).zaxis.z = local_1a8.z;
        (sphere->plane).zaxis.x = local_1a8.x;
        (sphere->plane).zaxis.y = local_1a8.y;
        (sphere->plane).yaxis.z = local_c8.plane.zaxis.z;
        (sphere->plane).yaxis.x = local_c8.plane.zaxis.x;
        (sphere->plane).yaxis.y = local_c8.plane.zaxis.y;
        ON_CrossProduct(&local_1a8,&(sphere->plane).zaxis,&(sphere->plane).yaxis);
        (sphere->plane).xaxis.z = local_1a8.z;
        (sphere->plane).xaxis.x = local_1a8.x;
        (sphere->plane).xaxis.y = local_1a8.y;
        ON_Plane::UpdateEquation(&sphere->plane);
        sphere->radius = local_c8.radius;
      }
      goto LAB_005ab24b;
    }
  }
  bVar2 = false;
LAB_005ab24b:
  ON_Plane::~ON_Plane(&local_c8.plane);
  ON_Plane::~ON_Plane(&local_168);
  return bVar2;
}

Assistant:

bool ON_RevSurface::IsSpherical(ON_Sphere* sphere, double tolerance ) const
{
  bool rc = false;
  if ( m_curve )
  {
    ON_Plane plane;
    ON_Arc arc;
    ON_3dPoint P = m_curve->PointAt( m_curve->Domain().Mid() );
    plane.origin = m_axis.from;
    plane.yaxis = m_axis.Tangent();
    plane.zaxis = ON_CrossProduct( P-plane.origin, plane.yaxis );
    plane.zaxis.Unitize();
    plane.xaxis = ON_CrossProduct( plane.yaxis, plane.zaxis );
    plane.UpdateEquation();
    if ( plane.IsValid() )
    {
      if ( m_curve->IsArc( &plane, &arc, tolerance ) )
      {
        P = m_axis.ClosestPointTo( arc.Center() );
        if ( P.DistanceTo(arc.Center()) <= tolerance )
        {
          rc = true;
          if ( sphere )
          {
            sphere->plane.origin = arc.Center();
            sphere->plane.zaxis = m_axis.Tangent();
            sphere->plane.yaxis = arc.plane.zaxis;
            sphere->plane.xaxis = ON_CrossProduct( sphere->plane.zaxis, sphere->plane.yaxis );
            sphere->plane.UpdateEquation();
            sphere->radius = arc.radius;
          }
        }
      }
    }
  }
  return rc;
}